

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test8::executeIteration(GPUShaderFP64Test8 *this,_test_case *test_case)

{
  ostringstream *this_00;
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  bool *pbVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  GLint compile_status;
  int local_1d4;
  GPUShaderFP64Test8 *local_1d0;
  GLuint local_1c8 [4];
  undefined8 local_1b8;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1c8[0] = this->m_cs_id;
  local_1c8[1] = this->m_fs_id;
  local_1c8[2] = this->m_gs_id;
  local_1c8[3] = this->m_tc_id;
  local_1b8._0_4_ = this->m_te_id;
  local_1b8._4_4_ = this->m_vs_id;
  bVar8 = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1d0 = this;
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    GVar1 = local_1c8[lVar7];
    if (GVar1 != 0) {
      (**(code **)(lVar4 + 0x248))(GVar1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x2900);
      local_1d4 = 0;
      (**(code **)(lVar4 + 0xa70))(GVar1,0x8b81,&local_1d4);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x2906);
      if (local_1d4 == 0) {
        if (GVar1 == this->m_cs_id) {
          pbVar5 = (bool *)(test_case->cs_shader_body)._M_dataplus._M_p;
          pcVar6 = "Compute shader";
        }
        else if (GVar1 == this->m_fs_id) {
          pbVar5 = (bool *)(test_case->fs_shader_body)._M_dataplus._M_p;
          pcVar6 = "Fragment shader";
        }
        else if (GVar1 == this->m_gs_id) {
          pbVar5 = (bool *)(test_case->gs_shader_body)._M_dataplus._M_p;
          pcVar6 = "Geometry shader";
        }
        else if (GVar1 == this->m_tc_id) {
          pbVar5 = (bool *)(test_case->tc_shader_body)._M_dataplus._M_p;
          pcVar6 = "Tessellation control shader";
        }
        else if (GVar1 == this->m_te_id) {
          pbVar5 = (bool *)(test_case->te_shader_body)._M_dataplus._M_p;
          pcVar6 = "Tessellation evaluation shader";
        }
        else {
          bVar8 = GVar1 != this->m_vs_id;
          pbVar5 = (bool *)(test_case->vs_shader_body)._M_dataplus._M_p;
          if (bVar8) {
            pbVar5 = glcts::fixed_sample_locations_values + 1;
          }
          pcVar6 = "[?]";
          if (!bVar8) {
            pcVar6 = "Vertex shader";
          }
        }
        local_1b0._0_8_ =
             ((local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,pcVar6);
        std::operator<<((ostream *)this_00,
                        " has not compiled successfully, even though the shader is valid. Following is shader\'s body:\n"
                       );
        std::operator<<((ostream *)this_00,pbVar5);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        bVar8 = false;
        this = local_1d0;
      }
    }
  }
  return bVar8;
}

Assistant:

bool GPUShaderFP64Test8::executeIteration(const _test_case& test_case)
{
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	const glw::GLuint	 so_ids[]   = { m_cs_id, m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int	n_so_ids   = sizeof(so_ids) / sizeof(so_ids[0]);
	bool				  result	 = true;
	const char*			  stage_body = NULL;
	const char*			  stage_name = NULL;

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		const glw::GLuint so_id = so_ids[n_so_id];

		/* Skip compute shader if it is not supported */
		if (0 == so_id)
		{
			continue;
		}

		/* Compile the shader */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		/* Has the compilation succeeded as expected? */
		glw::GLint compile_status = GL_FALSE;

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_FALSE)
		{
			/* What is the current stage's name? */
			if (so_id == m_cs_id)
			{
				stage_body = test_case.cs_shader_body.c_str();
				stage_name = "Compute shader";
			}
			else if (so_id == m_fs_id)
			{
				stage_body = test_case.fs_shader_body.c_str();
				stage_name = "Fragment shader";
			}
			else if (so_id == m_gs_id)
			{
				stage_body = test_case.gs_shader_body.c_str();
				stage_name = "Geometry shader";
			}
			else if (so_id == m_tc_id)
			{
				stage_body = test_case.tc_shader_body.c_str();
				stage_name = "Tessellation control shader";
			}
			else if (so_id == m_te_id)
			{
				stage_body = test_case.te_shader_body.c_str();
				stage_name = "Tessellation evaluation shader";
			}
			else if (so_id == m_vs_id)
			{
				stage_body = test_case.vs_shader_body.c_str();
				stage_name = "Vertex shader";
			}
			else
			{
				/* Doesn't make much sense to throw exceptions here so.. */
				stage_body = "";
				stage_name = "[?]";
			}

			/* This shader should have never failed to compile! */
			m_testCtx.getLog() << tcu::TestLog::Message << stage_name
							   << " has not compiled successfully, even though the shader is valid."
								  " Following is shader's body:\n"
							   << stage_body << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all shader objects) */

	return result;
}